

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GravityCompensationHelpers.cpp
# Opt level: O3

bool __thiscall
iDynTree::GravityCompensationHelper::getGravityCompensationTorques
          (GravityCompensationHelper *this,JointDOFsDoubleArray *jointTrqs)

{
  char cVar1;
  VectorDynSize *pVVar2;
  char *pcVar3;
  
  if (this->m_isModelValid == false) {
    pcVar3 = "Model not set";
  }
  else if (this->m_isKinematicsUpdated == false) {
    pcVar3 = "Kinematic information not set";
  }
  else {
    cVar1 = iDynTree::RNEADynamicPhase
                      (&this->m_model,&this->m_dynamicTraversal,&this->m_jointPos,&this->m_linkVels,
                       &this->m_linkProperAccs,&this->m_linkNetExternalWrenchesZero,
                       &this->m_linkIntWrenches,&this->m_generalizedTorques);
    if (cVar1 != '\0') {
      pVVar2 = (VectorDynSize *)iDynTree::FreeFloatingGeneralizedTorques::jointTorques();
      iDynTree::VectorDynSize::operator=((VectorDynSize *)jointTrqs,pVVar2);
      return true;
    }
    pcVar3 = "Error in computing RNEADynamicPhase";
  }
  iDynTree::reportError("GravityCompensationHelper","getGravityCompensationTorques",pcVar3);
  return false;
}

Assistant:

bool GravityCompensationHelper::getGravityCompensationTorques(JointDOFsDoubleArray& jointTrqs)
  {
    if (!m_isModelValid)
    {
      iDynTree::reportError("GravityCompensationHelper", "getGravityCompensationTorques", "Model not set");
      return false;
    }
    
    if (!m_isKinematicsUpdated)
    {
      iDynTree::reportError("GravityCompensationHelper", "getGravityCompensationTorques", "Kinematic information not set");
      return false;
    }
    
    // Compute joint torques
    bool ok = iDynTree::RNEADynamicPhase(m_model, m_dynamicTraversal, m_jointPos, m_linkVels, m_linkProperAccs,
                                         m_linkNetExternalWrenchesZero, m_linkIntWrenches, m_generalizedTorques);
    if (!ok)
    {
      iDynTree::reportError("GravityCompensationHelper", "getGravityCompensationTorques", "Error in computing RNEADynamicPhase");
      return false;
    }
    
    // store computed torques
    jointTrqs = m_generalizedTorques.jointTorques();
    
    return true;
  }